

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::checkFirstWord
          (HMpsFF *this,string *strline,size_t *start,size_t *end,string *word)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  size_t sVar13;
  size_t *in_RCX;
  long *in_RDX;
  string *in_RSI;
  long in_RDI;
  string *in_R8;
  Parsekey key;
  string upper_word;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec1;
  undefined1 in_stack_fffffffffffffec2;
  undefined1 in_stack_fffffffffffffec3;
  undefined1 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  undefined1 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffec9;
  undefined1 in_stack_fffffffffffffeca;
  undefined1 in_stack_fffffffffffffecb;
  undefined1 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffecd;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  undefined1 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed1;
  undefined1 in_stack_fffffffffffffed2;
  undefined1 in_stack_fffffffffffffed3;
  byte in_stack_fffffffffffffed4;
  byte in_stack_fffffffffffffed5;
  char in_stack_fffffffffffffed6;
  string *in_stack_fffffffffffffed8;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  string local_c8 [36];
  Parsekey local_a4;
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  string *local_30;
  size_t *local_28;
  long *local_20;
  string *local_18;
  Parsekey local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  lVar10 = std::__cxx11::string::find_first_not_of((char *)in_RSI,0x86ffca);
  *local_20 = lVar10;
  lVar10 = *local_20;
  lVar11 = std::__cxx11::string::size();
  if (lVar10 + 1 == lVar11) {
LAB_00465bb1:
    *local_28 = *local_20 + 1;
    pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    std::__cxx11::string::operator=(local_30,*pcVar12);
    return kNone;
  }
  std::__cxx11::string::operator[]((ulong)local_18);
  bVar1 = is_empty(in_stack_fffffffffffffed6,
                   (string *)
                   CONCAT17(in_stack_fffffffffffffecf,
                            CONCAT16(in_stack_fffffffffffffece,
                                     CONCAT15(in_stack_fffffffffffffecd,
                                              CONCAT14(in_stack_fffffffffffffecc,
                                                       CONCAT13(in_stack_fffffffffffffecb,
                                                                CONCAT12(in_stack_fffffffffffffeca,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffec9,
                                                  in_stack_fffffffffffffec8))))))));
  if (bVar1) goto LAB_00465bb1;
  sVar13 = first_word_end(in_stack_ffffffffffffff18,
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  *local_28 = sVar13;
  std::__cxx11::string::substr((ulong)local_50,(ulong)local_18);
  std::__cxx11::string::operator=(local_30,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_70,local_30);
  toupper((int)local_70);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     CONCAT14(in_stack_fffffffffffffec4,
                                                              CONCAT13(in_stack_fffffffffffffec3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                          (char *)CONCAT17(in_stack_fffffffffffffebf,
                                           CONCAT16(in_stack_fffffffffffffebe,
                                                    in_stack_fffffffffffffeb8)));
  if (((bVar1) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffec7,
                                        CONCAT16(in_stack_fffffffffffffec6,
                                                 CONCAT15(in_stack_fffffffffffffec5,
                                                          CONCAT14(in_stack_fffffffffffffec4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffec3,
                                                  CONCAT12(in_stack_fffffffffffffec2,
                                                           CONCAT11(in_stack_fffffffffffffec1,
                                                                    in_stack_fffffffffffffec0)))))))
                               ,(char *)CONCAT17(in_stack_fffffffffffffebf,
                                                 CONCAT16(in_stack_fffffffffffffebe,
                                                          in_stack_fffffffffffffeb8))), bVar1)) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffec7,
                                       CONCAT16(in_stack_fffffffffffffec6,
                                                CONCAT15(in_stack_fffffffffffffec5,
                                                         CONCAT14(in_stack_fffffffffffffec4,
                                                                  CONCAT13(in_stack_fffffffffffffec3
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                              (char *)CONCAT17(in_stack_fffffffffffffebf,
                                               CONCAT16(in_stack_fffffffffffffebe,
                                                        in_stack_fffffffffffffeb8))), bVar1)) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_18);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x430),local_a0);
    std::__cxx11::string::~string(local_a0);
    in_stack_fffffffffffffed8 = local_18;
  }
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     CONCAT14(in_stack_fffffffffffffec4,
                                                              CONCAT13(in_stack_fffffffffffffec3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                          (char *)CONCAT17(in_stack_fffffffffffffebf,
                                           CONCAT16(in_stack_fffffffffffffebe,
                                                    in_stack_fffffffffffffeb8)));
  if ((bool)uVar2) {
    local_a4 = kName;
  }
  else {
    in_stack_fffffffffffffed6 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffec7,
                                  CONCAT16(in_stack_fffffffffffffec6,
                                           CONCAT15(in_stack_fffffffffffffec5,
                                                    CONCAT14(in_stack_fffffffffffffec4,
                                                             CONCAT13(in_stack_fffffffffffffec3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                         (char *)CONCAT17(in_stack_fffffffffffffebf,
                                          CONCAT16(in_stack_fffffffffffffebe,
                                                   in_stack_fffffffffffffeb8)));
    if ((bool)in_stack_fffffffffffffed6) {
      local_a4 = kObjsense;
    }
    else {
      std::__cxx11::string::substr((ulong)local_c8,(ulong)local_70);
      in_stack_fffffffffffffed5 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffec7,
                                    CONCAT16(in_stack_fffffffffffffec6,
                                             CONCAT15(in_stack_fffffffffffffec5,
                                                      CONCAT14(in_stack_fffffffffffffec4,
                                                               CONCAT13(in_stack_fffffffffffffec3,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                           (char *)CONCAT17(in_stack_fffffffffffffebf,
                                            CONCAT16(in_stack_fffffffffffffebe,
                                                     in_stack_fffffffffffffeb8)));
      std::__cxx11::string::~string(local_c8);
      if ((in_stack_fffffffffffffed5 & 1) == 0) {
        std::__cxx11::string::substr((ulong)&stack0xffffffffffffff18,(ulong)local_70);
        in_stack_fffffffffffffed4 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffec7,
                                      CONCAT16(in_stack_fffffffffffffec6,
                                               CONCAT15(in_stack_fffffffffffffec5,
                                                        CONCAT14(in_stack_fffffffffffffec4,
                                                                 CONCAT13(in_stack_fffffffffffffec3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                             (char *)CONCAT17(in_stack_fffffffffffffebf,
                                              CONCAT16(in_stack_fffffffffffffebe,
                                                       in_stack_fffffffffffffeb8)));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
        if ((in_stack_fffffffffffffed4 & 1) == 0) {
          in_stack_fffffffffffffed3 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffec7,
                                        CONCAT16(in_stack_fffffffffffffec6,
                                                 CONCAT15(in_stack_fffffffffffffec5,
                                                          CONCAT14(in_stack_fffffffffffffec4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffec3,
                                                  CONCAT12(in_stack_fffffffffffffec2,
                                                           CONCAT11(in_stack_fffffffffffffec1,
                                                                    in_stack_fffffffffffffec0)))))))
                               ,(char *)CONCAT17(in_stack_fffffffffffffebf,
                                                 CONCAT16(in_stack_fffffffffffffebe,
                                                          in_stack_fffffffffffffeb8)));
          if ((bool)in_stack_fffffffffffffed3) {
            local_a4 = kRows;
          }
          else {
            in_stack_fffffffffffffed2 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffec7,
                                             CONCAT16(in_stack_fffffffffffffec6,
                                                      CONCAT15(in_stack_fffffffffffffec5,
                                                               CONCAT14(in_stack_fffffffffffffec4,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffec3,
                                                  CONCAT12(in_stack_fffffffffffffec2,
                                                           CONCAT11(in_stack_fffffffffffffec1,
                                                                    in_stack_fffffffffffffec0)))))))
                                 ,(char *)CONCAT17(in_stack_fffffffffffffebf,
                                                   CONCAT16(in_stack_fffffffffffffebe,
                                                            in_stack_fffffffffffffeb8)));
            if ((bool)in_stack_fffffffffffffed2) {
              local_a4 = kCols;
            }
            else {
              in_stack_fffffffffffffed1 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffec7,
                                               CONCAT16(in_stack_fffffffffffffec6,
                                                        CONCAT15(in_stack_fffffffffffffec5,
                                                                 CONCAT14(in_stack_fffffffffffffec4,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffec3,
                                                  CONCAT12(in_stack_fffffffffffffec2,
                                                           CONCAT11(in_stack_fffffffffffffec1,
                                                                    in_stack_fffffffffffffec0)))))))
                                   ,(char *)CONCAT17(in_stack_fffffffffffffebf,
                                                     CONCAT16(in_stack_fffffffffffffebe,
                                                              in_stack_fffffffffffffeb8)));
              if ((bool)in_stack_fffffffffffffed1) {
                local_a4 = kRhs;
              }
              else {
                in_stack_fffffffffffffed0 =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffffec7,
                                                 CONCAT16(in_stack_fffffffffffffec6,
                                                          CONCAT15(in_stack_fffffffffffffec5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffec4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                     (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                      CONCAT16(in_stack_fffffffffffffebe,
                                                               in_stack_fffffffffffffeb8)));
                if ((bool)in_stack_fffffffffffffed0) {
                  local_a4 = kBounds;
                }
                else {
                  in_stack_fffffffffffffecf =
                       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_fffffffffffffec7,
                                                   CONCAT16(in_stack_fffffffffffffec6,
                                                            CONCAT15(in_stack_fffffffffffffec5,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffec4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                       (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                        CONCAT16(in_stack_fffffffffffffebe,
                                                                 in_stack_fffffffffffffeb8)));
                  if ((bool)in_stack_fffffffffffffecf) {
                    local_a4 = kRanges;
                  }
                  else {
                    in_stack_fffffffffffffece =
                         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_fffffffffffffec7,
                                                     CONCAT16(in_stack_fffffffffffffec6,
                                                              CONCAT15(in_stack_fffffffffffffec5,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffec4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                         (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                          CONCAT16(in_stack_fffffffffffffebe,
                                                                   in_stack_fffffffffffffeb8)));
                    if ((bool)in_stack_fffffffffffffece) {
                      local_a4 = kQsection;
                    }
                    else {
                      in_stack_fffffffffffffecd =
                           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_fffffffffffffec7,
                                                       CONCAT16(in_stack_fffffffffffffec6,
                                                                CONCAT15(in_stack_fffffffffffffec5,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffec4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                           (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                            CONCAT16(in_stack_fffffffffffffebe,
                                                                     in_stack_fffffffffffffeb8)));
                      if ((bool)in_stack_fffffffffffffecd) {
                        local_a4 = kQmatrix;
                      }
                      else {
                        in_stack_fffffffffffffecc =
                             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_fffffffffffffec7,
                                                         CONCAT16(in_stack_fffffffffffffec6,
                                                                  CONCAT15(in_stack_fffffffffffffec5
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffec4,
                                                  CONCAT13(in_stack_fffffffffffffec3,
                                                           CONCAT12(in_stack_fffffffffffffec2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
                                             (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                              CONCAT16(in_stack_fffffffffffffebe,
                                                                       in_stack_fffffffffffffeb8)));
                        if ((bool)in_stack_fffffffffffffecc) {
                          local_a4 = kQuadobj;
                        }
                        else {
                          in_stack_fffffffffffffecb =
                               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(in_stack_fffffffffffffec7,
                                                           CONCAT16(in_stack_fffffffffffffec6,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffec5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           CONCAT13(in_stack_fffffffffffffec3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                               (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                CONCAT16(in_stack_fffffffffffffebe,
                                                                         in_stack_fffffffffffffeb8))
                                              );
                          if ((bool)in_stack_fffffffffffffecb) {
                            local_a4 = kQcmatrix;
                          }
                          else {
                            in_stack_fffffffffffffeca =
                                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffec7,
                                                             CONCAT16(in_stack_fffffffffffffec6,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffec5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           CONCAT13(in_stack_fffffffffffffec3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                 (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                  CONCAT16(in_stack_fffffffffffffebe
                                                                           ,
                                                  in_stack_fffffffffffffeb8)));
                            if ((bool)in_stack_fffffffffffffeca) {
                              local_a4 = kCsection;
                            }
                            else {
                              in_stack_fffffffffffffec9 =
                                   std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffec7,
                                                             CONCAT16(in_stack_fffffffffffffec6,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffec5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           CONCAT13(in_stack_fffffffffffffec3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                              if ((bool)in_stack_fffffffffffffec9) {
                                local_a4 = kDelayedrows;
                              }
                              else {
                                in_stack_fffffffffffffec8 =
                                     std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffec7,
                                                             CONCAT16(in_stack_fffffffffffffec6,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffec5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           CONCAT13(in_stack_fffffffffffffec3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                if ((bool)in_stack_fffffffffffffec8) {
                                  local_a4 = kModelcuts;
                                }
                                else {
                                  uVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffec7,
                                                             CONCAT16(in_stack_fffffffffffffec6,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffec5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           CONCAT13(in_stack_fffffffffffffec3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                  if ((bool)uVar3) {
                                    local_a4 = kUsercuts;
                                  }
                                  else {
                                    uVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(
                                                  in_stack_fffffffffffffec6,
                                                  CONCAT15(in_stack_fffffffffffffec5,
                                                           CONCAT14(in_stack_fffffffffffffec4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffec3,
                                                  CONCAT12(in_stack_fffffffffffffec2,
                                                           CONCAT11(in_stack_fffffffffffffec1,
                                                                    in_stack_fffffffffffffec0)))))))
                                                  ,(char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                    if ((bool)uVar4) {
                                      local_a4 = kIndicators;
                                    }
                                    else {
                                      uVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_fffffffffffffec5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           CONCAT13(in_stack_fffffffffffffec3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                      if ((bool)uVar5) {
                                        local_a4 = kSets;
                                      }
                                      else {
                                        uVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           CONCAT13(in_stack_fffffffffffffec3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                        if ((bool)uVar6) {
                                          local_a4 = kSos;
                                        }
                                        else {
                                          uVar7 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,
                                                  CONCAT14(uVar6,CONCAT13(in_stack_fffffffffffffec3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                          if ((bool)uVar7) {
                                            local_a4 = kGencons;
                                          }
                                          else {
                                            uVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,
                                                  CONCAT14(uVar6,CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                            if ((bool)uVar8) {
                                              local_a4 = kPwlobj;
                                            }
                                            else {
                                              uVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,
                                                  CONCAT14(uVar6,CONCAT13(uVar7,CONCAT12(uVar8,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                              if ((bool)uVar9) {
                                                local_a4 = kPwlnam;
                                              }
                                              else {
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,
                                                  CONCAT14(uVar6,CONCAT13(uVar7,CONCAT12(uVar8,
                                                  CONCAT11(uVar9,in_stack_fffffffffffffec0))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                                if (bVar1) {
                                                  local_a4 = kPwlcon;
                                                }
                                                else {
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,
                                                  CONCAT14(uVar6,CONCAT13(uVar7,CONCAT12(uVar8,
                                                  CONCAT11(uVar9,bVar1))))))),
                                                  (char *)CONCAT17(in_stack_fffffffffffffebf,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffffebe,
                                                  in_stack_fffffffffffffeb8)));
                                                  if (!bVar1) {
                                                    local_4 = kNone;
                                                    goto LAB_00466415;
                                                  }
                                                  local_a4 = kEnd;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_a4 = kMin;
        }
      }
      else {
        local_a4 = kMax;
      }
    }
  }
  if (((local_a4 == kName) || (local_a4 == kObjsense)) ||
     ((local_a4 == kQcmatrix || (local_a4 == kQsection)))) {
    local_4 = local_a4;
  }
  else {
    bVar1 = is_end(in_stack_fffffffffffffed8,
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffed6,
                                           CONCAT15(in_stack_fffffffffffffed5,
                                                    CONCAT14(in_stack_fffffffffffffed4,
                                                             CONCAT13(in_stack_fffffffffffffed3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffed2,
                                                  CONCAT11(in_stack_fffffffffffffed1,
                                                           in_stack_fffffffffffffed0))))))),
                   (string *)
                   CONCAT17(in_stack_fffffffffffffecf,
                            CONCAT16(in_stack_fffffffffffffece,
                                     CONCAT15(in_stack_fffffffffffffecd,
                                              CONCAT14(in_stack_fffffffffffffecc,
                                                       CONCAT13(in_stack_fffffffffffffecb,
                                                                CONCAT12(in_stack_fffffffffffffeca,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffec9,
                                                  in_stack_fffffffffffffec8))))))));
    if (bVar1) {
      local_4 = local_a4;
    }
    else {
      local_4 = kNone;
    }
  }
LAB_00466415:
  std::__cxx11::string::~string(local_70);
  return local_4;
}

Assistant:

HMpsFF::Parsekey HMpsFF::checkFirstWord(std::string& strline, size_t& start,
                                        size_t& end, std::string& word) const {
  start = strline.find_first_not_of(" ");
  if ((start + 1 == strline.size()) || is_empty(strline[start + 1])) {
    end = start + 1;
    word = strline[start];
    return HMpsFF::Parsekey::kNone;
  }

  end = first_word_end(strline, start + 1);

  word = strline.substr(start, end - start);

  // Create an upper-case version of WORD, so that keywords are
  // read as if they were in lower or mixed case
  std::string upper_word = word;
  toupper(upper_word);

  // store rest of strline for keywords that have arguments
  if (upper_word == "QCMATRIX" || upper_word == "QSECTION" ||
      upper_word == "CSECTION")
    section_args = strline.substr(end, strline.length());

  HMpsFF::Parsekey key;

  if (upper_word == "NAME")
    key = HMpsFF::Parsekey::kName;
  else if (upper_word == "OBJSENSE")
    key = HMpsFF::Parsekey::kObjsense;
  else if (upper_word.substr(0, 3) == "MAX")
    key = HMpsFF::Parsekey::kMax;
  else if (upper_word.substr(0, 3) == "MIN")
    key = HMpsFF::Parsekey::kMin;
  else if (upper_word == "ROWS")
    key = HMpsFF::Parsekey::kRows;
  else if (upper_word == "COLUMNS")
    key = HMpsFF::Parsekey::kCols;
  else if (upper_word == "RHS")
    key = HMpsFF::Parsekey::kRhs;
  else if (upper_word == "BOUNDS")
    key = HMpsFF::Parsekey::kBounds;
  else if (upper_word == "RANGES")
    key = HMpsFF::Parsekey::kRanges;
  else if (upper_word == "QSECTION")
    key = HMpsFF::Parsekey::kQsection;
  else if (upper_word == "QMATRIX")
    key = HMpsFF::Parsekey::kQmatrix;
  else if (upper_word == "QUADOBJ")
    key = HMpsFF::Parsekey::kQuadobj;
  else if (upper_word == "QCMATRIX")
    key = HMpsFF::Parsekey::kQcmatrix;
  else if (upper_word == "CSECTION")
    key = HMpsFF::Parsekey::kCsection;
  else if (upper_word == "DELAYEDROWS")
    key = HMpsFF::Parsekey::kDelayedrows;
  else if (upper_word == "MODELCUTS")
    key = HMpsFF::Parsekey::kModelcuts;
  else if (upper_word == "USERCUTS")
    key = HMpsFF::Parsekey::kUsercuts;
  else if (upper_word == "INDICATORS")
    key = HMpsFF::Parsekey::kIndicators;
  else if (upper_word == "SETS")
    key = HMpsFF::Parsekey::kSets;
  else if (upper_word == "SOS")
    key = HMpsFF::Parsekey::kSos;
  else if (upper_word == "GENCONS")
    key = HMpsFF::Parsekey::kGencons;
  else if (upper_word == "PWLOBJ")
    key = HMpsFF::Parsekey::kPwlobj;
  else if (upper_word == "PWLNAM")
    key = HMpsFF::Parsekey::kPwlnam;
  else if (upper_word == "PWLCON")
    key = HMpsFF::Parsekey::kPwlcon;
  else if (upper_word == "ENDATA")
    key = HMpsFF::Parsekey::kEnd;
  else
    return HMpsFF::Parsekey::kNone;
  // Can have keywords used as column names or names of RHS, BOUND,
  // RANGES etc, so assume this if there are non-blanks after the
  // apparent keyword. Only cases that don't work are NAME, OBJSENSE,
  // QCMATRIX and QSECTION, since they can be followed by text
  if (key == HMpsFF::Parsekey::kName || key == HMpsFF::Parsekey::kObjsense ||
      key == HMpsFF::Parsekey::kQcmatrix || key == HMpsFF::Parsekey::kQsection)
    return key;
  assert(key != HMpsFF::Parsekey::kNone);

  if (is_end(strline, end)) return key;

  return HMpsFF::Parsekey::kNone;
}